

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O2

void __thiscall FWadFile::SkinHack(FWadFile *this)

{
  uint uVar1;
  FWadFileLump *pFVar2;
  FWadFileLump *pFVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  bool bVar7;
  anon_union_16_3_9144b11c_for_FResourceLump_3 *paVar8;
  char cVar9;
  long lVar10;
  
  uVar5 = 0;
  bVar6 = 0;
  bVar7 = false;
  iVar4 = SkinHack::namespc;
  do {
    if ((this->super_FResourceFile).NumLumps <= uVar5) {
      if ((bool)(bVar7 & bVar6)) {
        Printf("\x1cHThe maps in %s will not be loaded because it has a skin.\n\x1cHYou should remove the skin from the wad to play these maps.\n"
               ,(this->super_FResourceFile).Filename);
        return;
      }
      return;
    }
    pFVar2 = this->Lumps;
    paVar8 = &pFVar2[uVar5].super_FResourceLump.field_3;
    cVar9 = paVar8->Name[0];
    if (cVar9 == 'S') {
      if ((((pFVar2[uVar5].super_FResourceLump.field_3.Name[1] == '_') &&
           (pFVar2[uVar5].super_FResourceLump.field_3.Name[2] == 'S')) &&
          (pFVar2[uVar5].super_FResourceLump.field_3.Name[3] == 'K')) &&
         (((pFVar2[uVar5].super_FResourceLump.field_3.Name[4] == 'I' &&
           (pFVar2[uVar5].super_FResourceLump.field_3.Name[5] == 'N')) &&
          (*(undefined2 *)((long)&pFVar2[uVar5].super_FResourceLump.field_3 + 6) = 0, !bVar7)))) {
        uVar1 = (this->super_FResourceFile).NumLumps;
        pFVar3 = this->Lumps;
        for (lVar10 = 0; (ulong)uVar1 * 0x58 - lVar10 != 0; lVar10 = lVar10 + 0x58) {
          *(int *)((long)&(pFVar3->super_FResourceLump).Namespace + lVar10) = iVar4;
        }
        iVar4 = iVar4 + 1;
        cVar9 = paVar8->Name[0];
        bVar7 = true;
        SkinHack::namespc = iVar4;
        goto LAB_005804d9;
      }
    }
    else {
LAB_005804d9:
      if (cVar9 == 'E') {
        if ((((byte)(pFVar2[uVar5].super_FResourceLump.field_3.Name[1] - 0x30U) < 10) &&
            (pFVar2[uVar5].super_FResourceLump.field_3.Name[2] == 'M')) &&
           ((byte)(pFVar2[uVar5].super_FResourceLump.field_3.Name[3] - 0x30U) < 10)) {
          cVar9 = pFVar2[uVar5].super_FResourceLump.field_3.Name[4];
          goto joined_r0x00580544;
        }
      }
      else if ((((cVar9 == 'M') && (pFVar2[uVar5].super_FResourceLump.field_3.Name[1] == 'A')) &&
               (pFVar2[uVar5].super_FResourceLump.field_3.Name[2] == 'P')) &&
              (((byte)(pFVar2[uVar5].super_FResourceLump.field_3.Name[3] - 0x30U) < 10 &&
               ((byte)(pFVar2[uVar5].super_FResourceLump.field_3.Name[4] - 0x30U) < 10)))) {
        cVar9 = pFVar2[uVar5].super_FResourceLump.field_3.Name[5];
joined_r0x00580544:
        if (-1 < cVar9) {
          bVar6 = 1;
        }
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void FWadFile::SkinHack ()
{
	static int namespc = ns_firstskin;
	bool skinned = false;
	bool hasmap = false;
	DWORD i;

	for (i = 0; i < NumLumps; i++)
	{
		FResourceLump *lump = &Lumps[i];

		if (lump->Name[0] == 'S' &&
			lump->Name[1] == '_' &&
			lump->Name[2] == 'S' &&
			lump->Name[3] == 'K' &&
			lump->Name[4] == 'I' &&
			lump->Name[5] == 'N')
		{ // Wad has at least one skin.
			lump->Name[6] = lump->Name[7] = 0;
			if (!skinned)
			{
				skinned = true;
				DWORD j;

				for (j = 0; j < NumLumps; j++)
				{
					Lumps[j].Namespace = namespc;
				}
				namespc++;
			}
		}
		if ((lump->Name[0] == 'M' &&
			 lump->Name[1] == 'A' &&
			 lump->Name[2] == 'P' &&
			 lump->Name[3] >= '0' && lump->Name[3] <= '9' &&
			 lump->Name[4] >= '0' && lump->Name[4] <= '9' &&
			 lump->Name[5] >= '\0')
			||
			(lump->Name[0] == 'E' &&
			 lump->Name[1] >= '0' && lump->Name[1] <= '9' &&
			 lump->Name[2] == 'M' &&
			 lump->Name[3] >= '0' && lump->Name[3] <= '9' &&
			 lump->Name[4] >= '\0'))
		{
			hasmap = true;
		}
	}
	if (skinned && hasmap)
	{
		Printf (TEXTCOLOR_BLUE
			"The maps in %s will not be loaded because it has a skin.\n"
			TEXTCOLOR_BLUE
			"You should remove the skin from the wad to play these maps.\n",
			Filename);
	}
}